

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_header.hpp
# Opt level: O0

bool __thiscall
ELFIO::elf_header_impl<ELFIO::Elf32_Ehdr>::save
          (elf_header_impl<ELFIO::Elf32_Ehdr> *this,ostream *stream)

{
  address_translator *this_00;
  byte bVar1;
  streampos local_38;
  streampos local_28;
  ostream *local_18;
  ostream *stream_local;
  elf_header_impl<ELFIO::Elf32_Ehdr> *this_local;
  
  this_00 = this->translator;
  local_18 = stream;
  stream_local = (ostream *)this;
  std::fpos<__mbstate_t>::fpos(&local_38,0);
  local_28 = address_translator::operator[](this_00,local_38);
  std::ostream::seekp(stream,local_28._M_off,local_28._M_state);
  std::ostream::write((char *)local_18,(long)&this->header);
  bVar1 = std::ios::good();
  return (bool)(bVar1 & 1);
}

Assistant:

bool save( std::ostream& stream ) const override
    {
        stream.seekp( ( *translator )[0] );
        stream.write( reinterpret_cast<const char*>( &header ),
                      sizeof( header ) );

        return stream.good();
    }